

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O0

int IDAGetCurrentTime(void *ida_mem,sunrealtype *tcur)

{
  undefined8 *in_RSI;
  long in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x47b,"IDAGetCurrentTime",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x2a8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetCurrentTime(void* ida_mem, sunrealtype* tcur)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  *tcur = IDA_mem->ida_tn;

  return (IDA_SUCCESS);
}